

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O0

void __thiscall RigidBodyDynamics::ConstraintSet::clear(ConstraintSet *this)

{
  size_type sVar1;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pDVar2;
  long in_RDI;
  uint i;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffffc0;
  undefined4 local_c;
  
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero(in_stack_ffffffffffffffc0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero(in_stack_ffffffffffffffc0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero(in_stack_ffffffffffffffc0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffffc0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero(in_stack_ffffffffffffffc0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero(in_stack_ffffffffffffffc0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffffc0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffffc0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero(in_stack_ffffffffffffffc0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero(in_stack_ffffffffffffffc0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffffc0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero(in_stack_ffffffffffffffc0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero(in_stack_ffffffffffffffc0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero(in_stack_ffffffffffffffc0);
  local_c = 0;
  while( true ) {
    sVar1 = std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::size
                      ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                       (in_RDI + 0x220));
    if (sVar1 <= local_c) break;
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               (in_RDI + 0x220),(ulong)local_c);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffffc0);
    local_c = local_c + 1;
  }
  local_c = 0;
  while( true ) {
    sVar1 = std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::size
                      ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                       (in_RDI + 0x238));
    if (sVar1 <= local_c) break;
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               (in_RDI + 0x238),(ulong)local_c);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffffc0);
    local_c = local_c + 1;
  }
  local_c = 0;
  while( true ) {
    sVar1 = std::vector<Vector3_t,_std::allocator<Vector3_t>_>::size
                      ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(in_RDI + 0x250));
    if (sVar1 <= local_c) break;
    std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
              ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(in_RDI + 0x250),(ulong)local_c);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffffc0);
    local_c = local_c + 1;
  }
  local_c = 0;
  while( true ) {
    sVar1 = std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::size
                      ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                       (in_RDI + 0x268));
    if (sVar1 <= local_c) break;
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               (in_RDI + 0x268),(ulong)local_c);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffffc0);
    local_c = local_c + 1;
  }
  local_c = 0;
  while( true ) {
    this_00 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(ulong)local_c;
    pDVar2 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::size
                       ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                        (in_RDI + 0x280));
    if (pDVar2 <= this_00) break;
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               (in_RDI + 0x280),(ulong)local_c);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)this_00);
    local_c = local_c + 1;
  }
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero(this_00);
  return;
}

Assistant:

void ConstraintSet::clear() {
	acceleration.setZero();
	force.setZero();
	impulse.setZero();

	H.setZero();
	C.setZero();
	gamma.setZero();
	G.setZero();
	A.setZero();
	b.setZero();
	x.setZero();

	K.setZero();
	a.setZero();
	QDDot_t.setZero();
	QDDot_0.setZero();

	unsigned int i;
	for (i = 0; i < f_t.size(); i++)
		f_t[i].setZero();

	for (i = 0; i < f_ext_constraints.size(); i++)
		f_ext_constraints[i].setZero();

	for (i = 0; i < point_accel_0.size(); i++)
		point_accel_0[i].setZero();

	for (i = 0; i < d_pA.size(); i++)
		d_pA[i].setZero();

	for (i = 0; i < d_a.size(); i++)
		d_a[i].setZero();

	d_u.setZero();
}